

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SetTemplateNode::SetTemplateNode
          (SetTemplateNode *this,Location *loc,string *name,shared_ptr<minja::TemplateNode> *tv)

{
  string *in_RDX;
  Location *in_RDI;
  TemplateNode *in_stack_ffffffffffffffd0;
  
  TemplateNode::TemplateNode(in_stack_ffffffffffffffd0,in_RDI);
  (in_RDI->source).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_do_render_0042a750;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,in_RDX);
  std::shared_ptr<minja::TemplateNode>::shared_ptr
            ((shared_ptr<minja::TemplateNode> *)in_stack_ffffffffffffffd0,
             (shared_ptr<minja::TemplateNode> *)in_RDI);
  return;
}

Assistant:

SetTemplateNode(const Location & loc, const std::string & name, std::shared_ptr<TemplateNode> && tv)
        : TemplateNode(loc), name(name), template_value(std::move(tv)) {}